

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

bool __thiscall
wallet::DescriptorScriptPubKeyMan::CheckDecryptionKey
          (DescriptorScriptPubKeyMan *this,CKeyingMaterial *master_key)

{
  bool bVar1;
  size_t sVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  runtime_error *this_00;
  LogFlags in_R9;
  bool bVar5;
  long in_FS_OFFSET;
  bool bVar6;
  string_view logging_function;
  string_view source_file;
  span<const_unsigned_char,_18446744073709551615UL> crypted_secret;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock55;
  _Rb_tree_node_base *p_Var7;
  undefined1 local_58 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_50;
  unique_lock<std::recursive_mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._M_device = &(this->cs_desc_man).super_recursive_mutex;
  local_48._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_48);
  if ((this->m_map_keys)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    p_Var4 = (this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    sVar2 = (this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    bVar6 = sVar2 == 0;
    p_Var7 = &(this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (p_Var4 == p_Var7) {
      if (sVar2 == 0) goto LAB_0022230f;
      goto LAB_002221b0;
    }
    bVar5 = false;
    do {
      local_58[0] = false;
      local_50._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
      crypted_secret._M_extent._M_extent_value =
           (long)p_Var4[4]._M_parent - (long)*(pointer *)(p_Var4 + 4);
      crypted_secret._M_ptr = *(pointer *)(p_Var4 + 4);
      bVar3 = DecryptKey(master_key,crypted_secret,(CPubKey *)&p_Var4[1]._M_right,(CKey *)local_58);
      bVar1 = this->m_decryption_thoroughly_checked;
      if (!bVar3) {
        bVar5 = true;
      }
      if (local_50._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
        SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                  ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_50,
                   local_50._M_head_impl);
      }
      bVar6 = (bool)(bVar6 | bVar3);
      if ((!bVar3) || ((bVar1 & 1U) != 0)) break;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != p_Var7);
    if (bVar6 == false) goto LAB_002221b0;
    if (bVar5) {
      logging_function._M_str = "CheckDecryptionKey";
      logging_function._M_len = 0x12;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
      ;
      source_file._M_len = 99;
      LogPrintf_<>(logging_function,source_file,0x836,in_R9,(Level)p_Var7,(char *)master_key);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,
                 "Error unlocking wallet: some keys decrypt but not all. Your wallet file may be corrupt."
                );
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0022237a;
    }
LAB_0022230f:
    this->m_decryption_thoroughly_checked = true;
    bVar6 = true;
  }
  else {
LAB_002221b0:
    bVar6 = false;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
LAB_0022237a:
  __stack_chk_fail();
}

Assistant:

bool DescriptorScriptPubKeyMan::CheckDecryptionKey(const CKeyingMaterial& master_key)
{
    LOCK(cs_desc_man);
    if (!m_map_keys.empty()) {
        return false;
    }

    bool keyPass = m_map_crypted_keys.empty(); // Always pass when there are no encrypted keys
    bool keyFail = false;
    for (const auto& mi : m_map_crypted_keys) {
        const CPubKey &pubkey = mi.second.first;
        const std::vector<unsigned char> &crypted_secret = mi.second.second;
        CKey key;
        if (!DecryptKey(master_key, crypted_secret, pubkey, key)) {
            keyFail = true;
            break;
        }
        keyPass = true;
        if (m_decryption_thoroughly_checked)
            break;
    }
    if (keyPass && keyFail) {
        LogPrintf("The wallet is probably corrupted: Some keys decrypt but not all.\n");
        throw std::runtime_error("Error unlocking wallet: some keys decrypt but not all. Your wallet file may be corrupt.");
    }
    if (keyFail || !keyPass) {
        return false;
    }
    m_decryption_thoroughly_checked = true;
    return true;
}